

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogger.cpp
# Opt level: O3

void __thiscall clog::AsyncLogger::AsyncLogger(AsyncLogger *this,int flushInterval)

{
  FixBuffer<4194304> *pFVar1;
  
  this->flushInterval_ = flushInterval;
  this->running_ = false;
  (this->thread_)._M_id._M_thread = 0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cond_);
  pFVar1 = (FixBuffer<4194304> *)operator_new(0x400008);
  pFVar1->cur_ = (char *)pFVar1;
  (this->currentBuffer_)._M_t.
  super___uniq_ptr_impl<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_clog::detail::FixBuffer<4194304>_*,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>
  .super__Head_base<0UL,_clog::detail::FixBuffer<4194304>_*,_false>._M_head_impl = pFVar1;
  pFVar1 = (FixBuffer<4194304> *)operator_new(0x400008);
  pFVar1->cur_ = (char *)pFVar1;
  (this->nextBuffer_)._M_t.
  super___uniq_ptr_impl<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_clog::detail::FixBuffer<4194304>_*,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>
  .super__Head_base<0UL,_clog::detail::FixBuffer<4194304>_*,_false>._M_head_impl = pFVar1;
  (this->buffers_).
  super__Vector_base<std::unique_ptr<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>,_std::allocator<std::unique_ptr<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::unique_ptr<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>,_std::allocator<std::unique_ptr<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::unique_ptr<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>,_std::allocator<std::unique_ptr<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>,_std::allocator<std::unique_ptr<clog::detail::FixBuffer<4194304>,_std::default_delete<clog::detail::FixBuffer<4194304>_>_>_>_>
  ::reserve(&this->buffers_,0x10);
  return;
}

Assistant:

AsyncLogger::AsyncLogger(int flushInterval)
    : flushInterval_(flushInterval),
      running_(false),
      thread_(),
      mutex_(),
      cond_(),
      currentBuffer_(new Buffer),
      nextBuffer_(new Buffer),
      buffers_()
{
    buffers_.reserve(16);
}